

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.c
# Opt level: O2

yrmcds_error
yrmcds_incr2(yrmcds *c,char *key,size_t key_len,uint64_t value,uint64_t initial,uint32_t expire,
            int quiet,uint32_t *serial)

{
  yrmcds_error yVar1;
  char extras [20];
  
  if (key_len == 0 || (key == (char *)0x0 || c == (yrmcds *)0x0)) {
    yVar1 = YRMCDS_BAD_ARGUMENT;
  }
  else {
    if (c->text_mode == 0) {
      extras._0_8_ = value >> 0x38 | (value & 0xff000000000000) >> 0x28 |
                     (value & 0xff0000000000) >> 0x18 | (value & 0xff00000000) >> 8 |
                     (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
                     (value & 0xff00) << 0x28 | value << 0x38;
      extras._8_8_ = initial >> 0x38 | (initial & 0xff000000000000) >> 0x28 |
                     (initial & 0xff0000000000) >> 0x18 | (initial & 0xff00000000) >> 8 |
                     (initial & 0xff000000) << 8 | (initial & 0xff0000) << 0x18 |
                     (initial & 0xff00) << 0x28 | initial << 0x38;
      extras._16_4_ =
           expire >> 0x18 | (expire & 0xff0000) >> 8 | (expire & 0xff00) << 8 | expire << 0x18;
      yVar1 = send_command(c,(uint)(quiet != 0) << 4 | YRMCDS_CMD_INCREMENT,0,serial,key_len,key,
                           0x14,extras,0,(char *)0x0);
      return yVar1;
    }
    yVar1 = YRMCDS_NOT_IMPLEMENTED;
  }
  return yVar1;
}

Assistant:

yrmcds_error yrmcds_incr2(yrmcds* c, const char* key, size_t key_len,
                          uint64_t value, uint64_t initial, uint32_t expire,
                          int quiet, uint32_t* serial) {
    if( c == NULL || key == NULL || key_len == 0 )
        return YRMCDS_BAD_ARGUMENT;

    if( c->text_mode )
        return YRMCDS_NOT_IMPLEMENTED;

    char extras[20];
    hton64(value, extras);
    hton64(initial, &extras[8]);
    hton32(expire, &extras[16]);
    return send_command(c, quiet ? YRMCDS_CMD_INCREMENTQ : YRMCDS_CMD_INCREMENT,
                        0, serial, key_len, key,
                        sizeof(extras), extras, 0, NULL);
}